

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
syntax_gtest_tests::iu_SyntaxTest_x_iutest_x_LongDouble_Test::Body
          (iu_SyntaxTest_x_iutest_x_LongDouble_Test *this)

{
  bool bVar1;
  Fixed *pFVar2;
  char *pcVar3;
  AssertionHelper local_7f8;
  Fixed local_7c8;
  undefined1 local_640 [8];
  AssertionResult iutest_ar_3;
  longdouble d_3;
  Fixed local_5d8;
  undefined1 local_450 [8];
  AssertionResult iutest_ar_2;
  longdouble d_2;
  Fixed local_3e8;
  undefined1 local_260 [8];
  AssertionResult iutest_ar_1;
  longdouble d_1;
  AssertionHelper local_218;
  Fixed local_1e8;
  undefined1 local_50 [8];
  AssertionResult iutest_ar;
  longdouble d;
  iu_SyntaxTest_x_iutest_x_LongDouble_Test *this_local;
  
  unique0x00076300 = (longdouble)1;
  if ((unique0x00076300 != (longdouble)0) || (NAN(unique0x00076300) || NAN((longdouble)0))) {
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperFloatingPointEQ<long_double>
              ((AssertionResult *)local_50,"1.0l","d",(longdouble)1,stack0xffffffffffffffd8);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
    if (!bVar1) {
      memset(&local_1e8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_1e8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_1e8,stack0xffffffffffffffd8);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_50);
      iutest::AssertionHelper::AssertionHelper
                (&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xd4,pcVar3,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_218,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_218);
      iutest::AssertionHelper::Fixed::~Fixed(&local_1e8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_50);
    if (!bVar1) {
      return;
    }
  }
  unique0x00076300 = (longdouble)1;
  if ((unique0x00076300 != (longdouble)0) || (NAN(unique0x00076300) || NAN((longdouble)0))) {
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperFloatingPointEQ<long_double>
              ((AssertionResult *)local_260,"1.0l","d",(longdouble)1,stack0xfffffffffffffdc8);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
    if (!bVar1) {
      memset(&local_3e8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3e8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_3e8,stack0xfffffffffffffdc8);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_260);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)((long)&d_2 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xd6,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)((long)&d_2 + 8),pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)((long)&d_2 + 8));
      iutest::AssertionHelper::Fixed::~Fixed(&local_3e8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  }
  unique0x00076300 = (longdouble)1;
  if ((unique0x00076300 != (longdouble)0) || (NAN(unique0x00076300) || NAN((longdouble)0))) {
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperFloatingPointEQ<long_double>
              ((AssertionResult *)local_450,"1.0l","d",(longdouble)1,stack0xfffffffffffffbd8);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
    if (!bVar1) {
      memset(&local_5d8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5d8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_5d8,stack0xfffffffffffffbd8);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_450);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)((long)&d_3 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xd8,pcVar3,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)((long)&d_3 + 8),pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)((long)&d_3 + 8));
      iutest::AssertionHelper::Fixed::~Fixed(&local_5d8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  }
  unique0x00076300 = (longdouble)1;
  if ((unique0x00076300 != (longdouble)0) || (NAN(unique0x00076300) || NAN((longdouble)0))) {
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperFloatingPointEQ<long_double>
              ((AssertionResult *)local_640,"1.0l","d",(longdouble)1,stack0xfffffffffffff9e8);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
    if (!bVar1) {
      memset(&local_7c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7c8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_7c8,stack0xfffffffffffff9e8);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_640);
      iutest::AssertionHelper::AssertionHelper
                (&local_7f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xda,pcVar3,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_7f8,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_7f8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7c8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  }
  return;
}

Assistant:

TEST(SyntaxTest, LongDouble)
{
    if( long double d = 1.0l )
        ASSERT_LONG_DOUBLE_EQ(1.0l, d) << d;
    if( long double d = 1.0l )
        EXPECT_LONG_DOUBLE_EQ(1.0l, d) << d;
    if( long double d = 1.0l )
        INFORM_LONG_DOUBLE_EQ(1.0l, d) << d;
    if( long double d = 1.0l )
        ASSUME_LONG_DOUBLE_EQ(1.0l, d) << d;
}